

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O0

uint256 * __thiscall CCoinsViewCache::GetBestBlock(CCoinsViewCache *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  bool bVar8;
  base_blob<256U> *in_RSI;
  uint256 *in_RDI;
  long in_FS_OFFSET;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar8 = base_blob<256U>::IsNull(in_RSI);
  if (bVar8) {
    (**(code **)(**(long **)((in_RSI->m_data)._M_elems + 8) + 0x10))(&local_28);
    *(undefined8 *)((in_RSI->m_data)._M_elems + 0x11) = local_28;
    *(undefined8 *)((in_RSI->m_data)._M_elems + 0x19) = local_20;
    *(undefined8 *)(in_RSI[1].m_data._M_elems + 1) = local_18;
    *(undefined8 *)(in_RSI[1].m_data._M_elems + 9) = local_10;
  }
  uVar1 = *(undefined4 *)((in_RSI->m_data)._M_elems + 0x11);
  uVar2 = *(undefined4 *)((in_RSI->m_data)._M_elems + 0x15);
  uVar3 = *(undefined4 *)((in_RSI->m_data)._M_elems + 0x19);
  uVar4 = *(undefined4 *)((in_RSI->m_data)._M_elems + 0x1d);
  uVar5 = *(undefined4 *)(in_RSI[1].m_data._M_elems + 5);
  uVar6 = *(undefined4 *)(in_RSI[1].m_data._M_elems + 9);
  uVar7 = *(undefined4 *)(in_RSI[1].m_data._M_elems + 0xd);
  *(undefined4 *)((in_RDI->super_base_blob<256U>).m_data._M_elems + 0x10) =
       *(undefined4 *)(in_RSI[1].m_data._M_elems + 1);
  *(undefined4 *)((in_RDI->super_base_blob<256U>).m_data._M_elems + 0x14) = uVar5;
  *(undefined4 *)((in_RDI->super_base_blob<256U>).m_data._M_elems + 0x18) = uVar6;
  *(undefined4 *)((in_RDI->super_base_blob<256U>).m_data._M_elems + 0x1c) = uVar7;
  *(undefined4 *)(in_RDI->super_base_blob<256U>).m_data._M_elems = uVar1;
  *(undefined4 *)((in_RDI->super_base_blob<256U>).m_data._M_elems + 4) = uVar2;
  *(undefined4 *)((in_RDI->super_base_blob<256U>).m_data._M_elems + 8) = uVar3;
  *(undefined4 *)((in_RDI->super_base_blob<256U>).m_data._M_elems + 0xc) = uVar4;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

uint256 CCoinsViewCache::GetBestBlock() const {
    if (hashBlock.IsNull())
        hashBlock = base->GetBestBlock();
    return hashBlock;
}